

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Char * Diligent::GetBufferModeString(BUFFER_MODE Mode)

{
  char *pcVar1;
  string msg;
  string local_30;
  
  if (GetBufferModeString(Diligent::BUFFER_MODE)::BuffModeToStr == '\0') {
    GetBufferModeString();
  }
  if (Mode < BUFFER_MODE_NUM_MODES) {
    pcVar1 = GetBufferModeString::BuffModeToStr.BufferModeStrings._M_elems[Mode];
  }
  else {
    pcVar1 = "Unknown buffer mode";
    FormatString<char[20]>(&local_30,(char (*) [20])"Unknown buffer mode");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"operator[]",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x525);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return pcVar1;
}

Assistant:

const Char* GetBufferModeString(BUFFER_MODE Mode)
{
    struct BufferModeToStringMap
    {
        BufferModeToStringMap()
        {
#define INIT_BUFF_MODE_STR(Mode) BufferModeStrings[Mode] = #Mode
            INIT_BUFF_MODE_STR(BUFFER_MODE_UNDEFINED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_FORMATTED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_STRUCTURED);
            INIT_BUFF_MODE_STR(BUFFER_MODE_RAW);
#undef INIT_BUFF_MODE_STR
            static_assert(BUFFER_MODE_NUM_MODES == 4, "Not all buffer mode strings initialized.");
        }

        const Char* operator[](BUFFER_MODE Mode) const
        {
            if (Mode >= BUFFER_MODE_UNDEFINED && Mode < BUFFER_MODE_NUM_MODES)
                return BufferModeStrings[Mode];
            else
            {
                UNEXPECTED("Unknown buffer mode");
                return "Unknown buffer mode";
            }
        }

    private:
        std::array<const Char*, BUFFER_MODE_NUM_MODES> BufferModeStrings{};
    };

    static const BufferModeToStringMap BuffModeToStr;
    return BuffModeToStr[Mode];
}